

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall Logger::start(Logger *this)

{
  anon_class_8_1_8991fb9c_for__M_head_impl local_40;
  string local_38;
  
  this->running = true;
  getDate_abi_cxx11_(&local_38,this);
  std::__cxx11::string::operator=((string *)&this->logCreateDate,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  createLogDir(this);
  createLogFile(this);
  local_40.this = this;
  std::thread::thread<Logger::start()::_lambda()_1_,,void>((thread *)&local_38,&local_40);
  std::thread::operator=(&this->logThread,(thread *)&local_38);
  std::thread::~thread((thread *)&local_38);
  local_40.this = this;
  std::thread::thread<Logger::start()::_lambda()_2_,,void>
            ((thread *)&local_38,(anon_class_8_1_8991fb9c_for__M_head_impl *)&local_40);
  std::thread::operator=(&this->timerThread,(thread *)&local_38);
  std::thread::~thread((thread *)&local_38);
  usleep(100000);
  return;
}

Assistant:

inline void start() 
    {
        running = true;
        logCreateDate = getDate();  // 获取当前日期
        createLogDir();     // 创建日志目录
        createLogFile();    // 创建日志文件
        // 启动日志处理线程
        logThread = std::thread([this]() {
            // std::cout << "日志处理线程启动" << std::endl;
            while(running) {
                while(!logQueue.empty())  {
                    std::unique_lock<std::mutex> lock(logQueueMtx);  // 加锁
                    cv.wait(lock, [this]() { return !logQueue.empty() || !running; });
                    if (!running) break;
                    auto& msg = logQueue.front();
                    if(msg.level >= logLevel) writeLog(msg.level, msg.time, msg.message); // 写入日志
                    logQueue.pop();
                }
                LOG_SLEEP(10); // 等待10毫秒
            }
            // std::cout << "日志处理线程结束" << std::endl;
        });
        // 启动定时器线程,定时读取日志配置文件
        timerThread = std::thread([this]() {
            // std::cout << "定时器线程启动" << std::endl;
            while(running) {
                if (this->checkConfigFileChange()) {
                    this->loadConfig();
                }
                std::this_thread::sleep_for(std::chrono::seconds(5));
            }
            // std::cout << "定时器线程结束" << std::endl;
        });
        LOG_SLEEP(100); // 等待日志处理线程启动
    }